

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O1

void __thiscall
TEST_MockComparatorCopierTest_customTypeOutputParameterMissing_Test::testBody
          (TEST_MockComparatorCopierTest_customTypeOutputParameterMissing_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  MockCheckedExpectedCall *pMVar3;
  UtestShell *test;
  undefined4 extraout_var;
  MockFailureReporterInstaller failureReporterInstaller;
  MockExpectedCallsListForTest expectations;
  MyTypeForTesting expectedObject;
  MyTypeForTestingCopier copier;
  MockExpectedParameterDidntHappenFailure expectedFailure;
  MockFailureReporterInstaller local_e1;
  SimpleString local_e0;
  SimpleString local_d0;
  MockExpectedCallsList local_c0;
  undefined **local_b0;
  undefined8 *local_a8;
  SimpleString local_a0;
  SimpleString local_90;
  undefined **local_80;
  TestFailure local_78;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_e1);
  local_b0 = &PTR__MyTypeForTesting_002b3450;
  local_a8 = (undefined8 *)
             operator_new(8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                          ,0x2e);
  *local_a8 = 0x1e248;
  local_80 = &PTR__MockNamedValueCopier_002b3c68;
  SimpleString::SimpleString((SimpleString *)&local_78,"");
  pMVar2 = mock((SimpleString *)&local_78,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)&local_c0,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])(pMVar2,&local_c0,&local_80);
  SimpleString::~SimpleString((SimpleString *)&local_c0);
  SimpleString::~SimpleString((SimpleString *)&local_78);
  MockExpectedCallsList::MockExpectedCallsList(&local_c0);
  local_c0._vptr_MockExpectedCallsList = (_func_int **)&PTR__MockExpectedCallsListForTest_002aaff0;
  SimpleString::SimpleString((SimpleString *)&local_78,"foo");
  pMVar3 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)&local_c0,(SimpleString *)&local_78);
  SimpleString::SimpleString(&local_e0,"MyTypeForTesting");
  SimpleString::SimpleString(&local_d0,"output");
  (*(pMVar3->super_MockExpectedCall)._vptr_MockExpectedCall[7])
            (pMVar3,&local_e0,&local_d0,&local_b0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::~SimpleString((SimpleString *)&local_78);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_e0,"foo");
  MockExpectedParameterDidntHappenFailure::MockExpectedParameterDidntHappenFailure
            ((MockExpectedParameterDidntHappenFailure *)&local_78,test,&local_e0,&local_c0,&local_c0
            );
  SimpleString::~SimpleString(&local_e0);
  SimpleString::SimpleString(&local_e0,"");
  pMVar2 = mock(&local_e0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_d0,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_d0);
  SimpleString::SimpleString(&local_90,"MyTypeForTesting");
  SimpleString::SimpleString(&local_a0,"output");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
            ((long *)CONCAT44(extraout_var,iVar1),&local_90,&local_a0,&local_b0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::SimpleString(&local_e0,"");
  pMVar2 = mock(&local_e0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_d0,"foo");
  (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_d0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::SimpleString(&local_e0,"");
  pMVar2 = mock(&local_e0,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_e0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
             ,0xee);
  SimpleString::SimpleString(&local_e0,"");
  pMVar2 = mock(&local_e0,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])(pMVar2);
  SimpleString::~SimpleString(&local_e0);
  TestFailure::~TestFailure(&local_78);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_c0);
  local_b0 = &PTR__MyTypeForTesting_002b3450;
  if (local_a8 != (undefined8 *)0x0) {
    operator_delete(local_a8,8);
  }
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_e1);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customTypeOutputParameterMissing)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting expectedObject(123464);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withOutputParameterOfTypeReturning("MyTypeForTesting", "output", &expectedObject);
    MockExpectedParameterDidntHappenFailure expectedFailure(mockFailureTest(), "foo", expectations, expectations);

    mock().expectOneCall("foo").withOutputParameterOfTypeReturning("MyTypeForTesting", "output", &expectedObject);
    mock().actualCall("foo");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);

    mock().removeAllComparatorsAndCopiers();
}